

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_ldm.c
# Opt level: O3

size_t ZSTD_ldm_generateSequences
                 (ldmState_t *ldmState,rawSeqStore_t *sequences,ldmParams_t *params,void *src,
                 size_t srcSize)

{
  BYTE **ppBVar1;
  U32 *pUVar2;
  ulong *puVar3;
  ulong *puVar4;
  uint uVar5;
  ldmEntry_t *plVar6;
  ulong *puVar7;
  size_t sVar8;
  rawSeq *prVar9;
  bool bVar10;
  byte bVar11;
  uint uVar12;
  size_t sVar13;
  XXH64_hash_t XVar14;
  byte bVar15;
  byte bVar16;
  uint uVar17;
  U32 UVar18;
  ulong uVar19;
  ulong uVar20;
  ulong *puVar21;
  ldmEntry_t *plVar22;
  U32 UVar23;
  ulong *puVar24;
  ulong *puVar25;
  long lVar26;
  BYTE *pBVar27;
  ulong uVar28;
  ulong uVar29;
  uint uVar30;
  ulong *puVar31;
  ulong *puVar32;
  ldmEntry_t **pplVar33;
  ulong *puVar34;
  ulong uVar35;
  ulong uVar36;
  BYTE *pBVar37;
  long lVar38;
  ulong *puVar39;
  ldmRollingHashState_t hashState;
  uint local_1cc;
  BYTE *local_1c8;
  uint local_194;
  ldmState_t *local_190;
  BYTE *local_188;
  ulong local_180;
  ulong *local_178;
  void *local_170;
  size_t local_168;
  ulong *local_160;
  uint local_154;
  uint local_150;
  uint local_14c;
  size_t local_148;
  BYTE *local_140;
  ulong local_138;
  ulong local_130;
  long local_128;
  BYTE *local_120;
  ulong *local_118;
  rawSeqStore_t *local_110;
  ldmMatchCandidate_t *local_108;
  ulong *local_100;
  ulong *local_f8;
  long local_f0;
  ulong local_e8;
  ulong local_e0;
  ldmEntry_t *local_d8;
  BYTE *local_d0;
  ulong local_c8;
  long local_c0;
  ulong *local_b8;
  long local_b0;
  ldmEntry_t **local_a8;
  size_t *local_a0;
  ulong *local_98;
  ulong *local_90;
  BYTE *local_88;
  BYTE *local_80;
  long local_78;
  ulong local_70;
  ulong local_68;
  ulong local_60;
  ulong *local_58;
  ulong *local_50;
  BYTE *local_48;
  ldmRollingHashState_t local_40;
  
  uVar30 = 1 << ((byte)params->windowLog & 0x1f);
  local_c0 = (ulong)((srcSize & 0xfffff) != 0) + (srcSize >> 0x14);
  if (local_c0 != 0) {
    local_b8 = (ulong *)((long)src + srcSize);
    local_150 = ~uVar30;
    local_a0 = ldmState->splitIndices;
    local_108 = ldmState->matchCandidates;
    uVar20 = sequences->size;
    local_a8 = &ldmState->matchCandidates[0].bucket;
    local_128 = 0;
    local_138 = 0;
    local_190 = ldmState;
    local_170 = src;
    local_154 = uVar30;
    local_148 = srcSize;
    do {
      if (sequences->capacity <= uVar20) {
        return 0;
      }
      puVar31 = (ulong *)((long)local_170 + local_128 * 0x100000);
      puVar24 = puVar31 + 0x20000;
      if (local_148 + local_128 * -0x100000 < 0x100000) {
        puVar24 = local_b8;
      }
      local_1c8 = (ldmState->window).base;
      uVar12 = (int)puVar24 - (int)local_1c8;
      if (uVar12 < 0xe0000001) {
        UVar18 = ldmState->loadedDictEnd;
      }
      else {
        UVar18 = params->hashLog;
        uVar17 = ((int)puVar31 - (int)local_1c8) + local_150;
        local_1c8 = local_1c8 + uVar17;
        (ldmState->window).base = local_1c8;
        ppBVar1 = &(ldmState->window).dictBase;
        *ppBVar1 = *ppBVar1 + uVar17;
        uVar12 = (ldmState->window).dictLimit;
        uVar5 = (ldmState->window).lowLimit;
        UVar23 = uVar5 - uVar17;
        if (uVar5 < uVar17 || UVar23 == 0) {
          UVar23 = 1;
        }
        (ldmState->window).lowLimit = UVar23;
        UVar23 = uVar12 - uVar17;
        if (uVar12 < uVar17 || UVar23 == 0) {
          UVar23 = 1;
        }
        (ldmState->window).dictLimit = UVar23;
        pUVar2 = &(ldmState->window).nbOverflowCorrections;
        *pUVar2 = *pUVar2 + 1;
        plVar6 = ldmState->hashTable;
        lVar38 = 0;
        do {
          uVar12 = plVar6[lVar38].offset;
          UVar23 = uVar12 - uVar17;
          if (uVar12 < uVar17) {
            UVar23 = 0;
          }
          plVar6[lVar38].offset = UVar23;
          lVar38 = lVar38 + 1;
        } while (1L << ((byte)UVar18 & 0x3f) != lVar38);
        ldmState->loadedDictEnd = 0;
        uVar12 = (int)puVar24 - (int)local_1c8;
        UVar18 = 0;
      }
      local_1cc = (ldmState->window).lowLimit;
      if (UVar18 + uVar30 < uVar12) {
        uVar12 = uVar12 - uVar30;
        if (local_1cc < uVar12) {
          (ldmState->window).lowLimit = uVar12;
          local_1cc = uVar12;
        }
        uVar12 = (ldmState->window).dictLimit;
        if (uVar12 < local_1cc) {
          (ldmState->window).dictLimit = local_1cc;
          uVar12 = local_1cc;
        }
        ldmState->loadedDictEnd = 0;
      }
      else {
        uVar12 = (ldmState->window).dictLimit;
      }
      bVar15 = (byte)params->bucketSizeLog;
      local_78 = 1L << (bVar15 & 0x3f);
      uVar5 = params->minMatchLength;
      if (local_1cc < uVar12) {
        local_48 = (ldmState->window).dictBase;
        uVar17 = local_1cc;
      }
      else {
        local_48 = (BYTE *)0x0;
        uVar17 = uVar12;
      }
      uVar19 = (long)puVar24 - (long)puVar31;
      local_50 = (ulong *)(local_48 + uVar12);
      local_178 = (ulong *)(local_48 + uVar17);
      if (uVar12 <= local_1cc) {
        local_178 = (ulong *)0x0;
      }
      local_118 = (ulong *)0x0;
      if (uVar12 > local_1cc) {
        local_118 = local_50;
      }
      local_180 = (ulong)uVar5;
      local_c8 = uVar19;
      local_130 = uVar20;
      if (local_180 <= uVar19) {
        pBVar37 = (BYTE *)((long)puVar31 + (uVar19 - 8));
        if (0x3f < uVar5) {
          uVar5 = 0x40;
        }
        bVar16 = (byte)params->hashRateLog;
        local_40.rolling = 0xffffffff;
        bVar11 = (char)uVar5 - bVar16;
        if (uVar5 <= params->hashRateLog - 1) {
          bVar11 = 0;
        }
        local_40.stopMask = ~(-1L << (bVar16 & 0x3f)) << (bVar11 & 0x3f);
        pBVar27 = (BYTE *)((long)puVar31 + local_180);
        if (pBVar27 < pBVar37) {
          puVar4 = (ulong *)(local_1c8 + uVar12);
          local_58 = (ulong *)(uVar19 + (long)puVar31);
          local_b0 = -local_180;
          local_14c = ~(-1 << ((char)params->hashLog - bVar15 & 0x1f));
          puVar3 = (ulong *)((long)local_58 - 7);
          local_f8 = (ulong *)((long)local_58 + -3);
          local_100 = (ulong *)((long)local_58 + -1);
          local_80 = local_1c8 + 8;
          local_88 = local_1c8 + -1;
          local_d0 = local_1c8 + (ulong)uVar12 + 8;
          local_98 = (ulong *)((long)local_118 + -1);
          local_140 = pBVar37;
          local_110 = sequences;
          do {
            local_194 = 0;
            sVar13 = ZSTD_ldm_gear_feed(&local_40,pBVar27,(long)pBVar37 - (long)pBVar27,local_a0,
                                        &local_194);
            uVar20 = local_180;
            uVar19 = (ulong)local_194;
            if (uVar19 != 0) {
              local_188 = pBVar27 + local_b0;
              uVar35 = 0;
              pplVar33 = local_a8;
              local_168 = sVar13;
              local_120 = pBVar27;
              do {
                pBVar37 = local_188 + ldmState->splitIndices[uVar35];
                XVar14 = XXH64(pBVar37,uVar20,0);
                uVar30 = (uint)XVar14 & local_14c;
                ((ldmMatchCandidate_t *)(pplVar33 + -2))->split = pBVar37;
                *(uint *)(pplVar33 + -1) = uVar30;
                *(U32 *)((long)pplVar33 + -4) = (U32)(XVar14 >> 0x20);
                *pplVar33 = ldmState->hashTable +
                            ((ulong)uVar30 << ((byte)params->bucketSizeLog & 0x3f));
                uVar35 = uVar35 + 1;
                pplVar33 = pplVar33 + 3;
              } while (uVar19 != uVar35);
              local_90 = (ulong *)(local_120 + local_168);
              uVar20 = 0;
              do {
                local_60 = uVar20;
                puVar7 = (ulong *)local_108[local_60].split;
                uVar30 = local_108[local_60].checksum;
                local_e0 = (ulong)local_108[local_60].hash;
                uVar20 = (long)puVar7 - (long)local_1c8;
                sVar13 = local_168;
                sequences = local_110;
                pBVar37 = local_140;
                local_68 = uVar19;
                if (puVar7 < puVar31) {
LAB_00671ca9:
                  bVar15 = (byte)params->bucketSizeLog;
                  pBVar27 = ldmState->bucketOffsets;
                  bVar11 = pBVar27[local_e0];
                  ldmState->hashTable[(local_e0 << (bVar15 & 0x3f)) + (ulong)bVar11] =
                       (ldmEntry_t)(uVar20 & 0xffffffff | (ulong)uVar30 << 0x20);
                  pBVar27[local_e0] = ~(byte)(-1 << (bVar15 & 0x1f)) & bVar11 + 1;
                }
                else {
                  plVar22 = local_108[local_60].bucket;
                  plVar6 = plVar22 + local_78;
                  local_160 = (ulong *)((long)puVar7 + -1);
                  local_e8 = 0;
                  local_f0 = 0;
                  local_188 = (BYTE *)0x0;
                  local_d8 = (ldmEntry_t *)0x0;
                  do {
                    if (plVar22->checksum == uVar30) {
                      uVar5 = plVar22->offset;
                      uVar35 = (ulong)uVar5;
                      if (uVar17 < uVar5) {
                        if (local_1cc < uVar12) {
                          puVar21 = local_58;
                          pBVar27 = local_1c8;
                          if (uVar5 < uVar12) {
                            puVar21 = local_50;
                            pBVar27 = local_48;
                          }
                          puVar32 = (ulong *)(pBVar27 + uVar35);
                          puVar34 = (ulong *)(((long)puVar21 - (long)puVar32) + (long)puVar7);
                          if (puVar24 <= puVar34) {
                            puVar34 = local_58;
                          }
                          puVar25 = puVar7;
                          puVar39 = puVar32;
                          if (puVar7 < (ulong *)((long)puVar34 - 7U)) {
                            if (*puVar32 == *puVar7) {
                              lVar38 = 0;
                              do {
                                puVar25 = (ulong *)((long)puVar7 + lVar38 + 8);
                                if ((ulong *)((long)puVar34 - 7U) <= puVar25) {
                                  puVar39 = (ulong *)(pBVar27 + lVar38 + uVar35 + 8);
                                  ldmState = local_190;
                                  goto LAB_006718a4;
                                }
                                lVar26 = lVar38 + uVar35 + 8;
                                lVar38 = lVar38 + 8;
                              } while (*(ulong *)(pBVar27 + lVar26) == *puVar25);
                              uVar28 = *puVar25 ^ *(ulong *)(pBVar27 + lVar26);
                              uVar29 = 0;
                              if (uVar28 != 0) {
                                for (; (uVar28 >> uVar29 & 1) == 0; uVar29 = uVar29 + 1) {
                                }
                              }
                              uVar29 = (uVar29 >> 3 & 0x1fffffff) + lVar38;
                              ldmState = local_190;
                            }
                            else {
                              uVar28 = *puVar7 ^ *puVar32;
                              uVar29 = 0;
                              if (uVar28 != 0) {
                                for (; (uVar28 >> uVar29 & 1) == 0; uVar29 = uVar29 + 1) {
                                }
                              }
                              uVar29 = uVar29 >> 3 & 0x1fffffff;
                            }
                          }
                          else {
LAB_006718a4:
                            if ((puVar25 < (ulong *)((long)puVar34 - 3U)) &&
                               ((int)*puVar39 == (int)*puVar25)) {
                              puVar25 = (ulong *)((long)puVar25 + 4);
                              puVar39 = (ulong *)((long)puVar39 + 4);
                            }
                            if ((puVar25 < (ulong *)((long)puVar34 - 1U)) &&
                               ((short)*puVar39 == (short)*puVar25)) {
                              puVar25 = (ulong *)((long)puVar25 + 2);
                              puVar39 = (ulong *)((long)puVar39 + 2);
                            }
                            if (puVar25 < puVar34) {
                              puVar25 = (ulong *)((long)puVar25 +
                                                 (ulong)((char)*puVar39 == (char)*puVar25));
                            }
                            uVar29 = (long)puVar25 - (long)puVar7;
                          }
                          if ((ulong *)((long)puVar32 + uVar29) == puVar21) {
                            puVar21 = (ulong *)((long)puVar7 + uVar29);
                            puVar34 = puVar21;
                            puVar25 = puVar4;
                            if (puVar21 < puVar3) {
                              if (*puVar4 == *puVar21) {
                                lVar38 = 0;
                                do {
                                  puVar34 = (ulong *)((long)puVar7 + lVar38 + uVar29 + 8);
                                  if (puVar3 <= puVar34) {
                                    puVar25 = (ulong *)(local_d0 + lVar38);
                                    ldmState = local_190;
                                    goto LAB_00671a43;
                                  }
                                  puVar25 = (ulong *)(local_d0 + lVar38);
                                  lVar38 = lVar38 + 8;
                                } while (*puVar25 == *puVar34);
                                uVar36 = *puVar34 ^ *puVar25;
                                uVar28 = 0;
                                if (uVar36 != 0) {
                                  for (; (uVar36 >> uVar28 & 1) == 0; uVar28 = uVar28 + 1) {
                                  }
                                }
                                uVar28 = (uVar28 >> 3 & 0x1fffffff) + lVar38;
                                ldmState = local_190;
                              }
                              else {
                                uVar36 = *puVar21 ^ *puVar4;
                                uVar28 = 0;
                                if (uVar36 != 0) {
                                  for (; (uVar36 >> uVar28 & 1) == 0; uVar28 = uVar28 + 1) {
                                  }
                                }
                                uVar28 = uVar28 >> 3 & 0x1fffffff;
                              }
                            }
                            else {
LAB_00671a43:
                              if ((puVar34 < local_f8) && ((int)*puVar25 == (int)*puVar34)) {
                                puVar34 = (ulong *)((long)puVar34 + 4);
                                puVar25 = (ulong *)((long)puVar25 + 4);
                              }
                              if ((puVar34 < local_100) && ((short)*puVar25 == (short)*puVar34)) {
                                puVar34 = (ulong *)((long)puVar34 + 2);
                                puVar25 = (ulong *)((long)puVar25 + 2);
                              }
                              if (puVar34 < puVar24) {
                                puVar34 = (ulong *)((long)puVar34 +
                                                   (ulong)((char)*puVar25 == (char)*puVar34));
                              }
                              uVar28 = (long)puVar34 - (long)puVar21;
                            }
                            uVar29 = uVar29 + uVar28;
                          }
                          if (local_180 <= uVar29) {
                            puVar21 = puVar4;
                            if (uVar5 < uVar12) {
                              puVar21 = local_178;
                            }
                            if (puVar31 < puVar7) {
                              lVar38 = 0;
                              if (puVar21 < puVar32) {
                                puVar34 = (ulong *)(pBVar27 + uVar35);
                                lVar38 = 0;
                                puVar25 = local_160;
                                do {
                                  puVar34 = (ulong *)((long)puVar34 + -1);
                                  if (((char)*puVar25 != *(char *)puVar34) ||
                                     (lVar38 = lVar38 + 1, puVar25 <= puVar31)) break;
                                  puVar25 = (ulong *)((long)puVar25 + -1);
                                } while (puVar21 < puVar34);
                              }
                            }
                            else {
                              lVar38 = 0;
                            }
                            if ((puVar21 != local_178) &&
                               ((ulong *)((long)puVar32 - lVar38) == puVar21)) {
                              if (local_178 < local_118) {
                                lVar26 = 0;
                                if (puVar31 < (ulong *)((long)puVar7 + -lVar38)) {
                                  puVar32 = (ulong *)(-lVar38 + (long)local_160);
                                  lVar26 = 0;
                                  puVar21 = local_98;
                                  do {
                                    if (((char)*puVar32 != (char)*puVar21) ||
                                       (lVar26 = lVar26 + 1, puVar32 <= puVar31)) break;
                                    puVar32 = (ulong *)((long)puVar32 + -1);
                                    bVar10 = local_178 < puVar21;
                                    puVar21 = (ulong *)((long)puVar21 + -1);
                                  } while (bVar10);
                                }
                              }
                              else {
                                lVar26 = 0;
                              }
                              lVar38 = lVar38 + lVar26;
                            }
LAB_00671b96:
                            if (local_188 < (BYTE *)(uVar29 + lVar38)) {
                              local_188 = (BYTE *)(uVar29 + lVar38);
                              local_f0 = lVar38;
                              local_e8 = uVar29;
                              local_d8 = plVar22;
                            }
                          }
                        }
                        else {
                          puVar21 = (ulong *)(local_1c8 + uVar35);
                          puVar32 = puVar7;
                          if (puVar7 < puVar3) {
                            if (*puVar21 == *puVar7) {
                              lVar38 = 0;
                              do {
                                puVar32 = (ulong *)((long)puVar7 + lVar38 + 8);
                                if (puVar3 <= puVar32) {
                                  puVar21 = (ulong *)(local_80 + lVar38 + uVar35);
                                  goto LAB_0067197c;
                                }
                                lVar26 = lVar38 + uVar35;
                                lVar38 = lVar38 + 8;
                              } while (*(ulong *)(local_80 + lVar26) == *puVar32);
                              uVar28 = *puVar32 ^ *(ulong *)(local_80 + lVar26);
                              uVar29 = 0;
                              if (uVar28 != 0) {
                                for (; (uVar28 >> uVar29 & 1) == 0; uVar29 = uVar29 + 1) {
                                }
                              }
                              uVar29 = (uVar29 >> 3 & 0x1fffffff) + lVar38;
                            }
                            else {
                              uVar28 = *puVar7 ^ *puVar21;
                              uVar29 = 0;
                              if (uVar28 != 0) {
                                for (; (uVar28 >> uVar29 & 1) == 0; uVar29 = uVar29 + 1) {
                                }
                              }
                              uVar29 = uVar29 >> 3 & 0x1fffffff;
                            }
                          }
                          else {
LAB_0067197c:
                            if ((puVar32 < local_f8) && ((int)*puVar21 == (int)*puVar32)) {
                              puVar32 = (ulong *)((long)puVar32 + 4);
                              puVar21 = (ulong *)((long)puVar21 + 4);
                            }
                            if ((puVar32 < local_100) && ((short)*puVar21 == (short)*puVar32)) {
                              puVar32 = (ulong *)((long)puVar32 + 2);
                              puVar21 = (ulong *)((long)puVar21 + 2);
                            }
                            if (puVar32 < puVar24) {
                              puVar32 = (ulong *)((long)puVar32 +
                                                 (ulong)((char)*puVar21 == (char)*puVar32));
                            }
                            uVar29 = (long)puVar32 - (long)puVar7;
                          }
                          if (local_180 <= uVar29) {
                            if ((puVar31 < puVar7) && (uVar12 < uVar5)) {
                              lVar38 = 0;
                              puVar21 = local_160;
                              puVar32 = (ulong *)(local_88 + uVar35);
                              do {
                                if (((char)*puVar21 != (char)*puVar32) ||
                                   (lVar38 = lVar38 + 1, puVar21 <= puVar31)) break;
                                puVar21 = (ulong *)((long)puVar21 + -1);
                                bVar10 = puVar4 < puVar32;
                                puVar32 = (ulong *)((long)puVar32 + -1);
                              } while (bVar10);
                            }
                            else {
                              lVar38 = 0;
                            }
                            goto LAB_00671b96;
                          }
                        }
                      }
                    }
                    plVar22 = plVar22 + 1;
                  } while (plVar22 < plVar6);
                  local_70 = uVar20;
                  if (local_d8 == (ldmEntry_t *)0x0) goto LAB_00671ca9;
                  sVar8 = local_110->size;
                  if (sVar8 == local_110->capacity) {
                    return 0xffffffffffffffba;
                  }
                  prVar9 = local_110->seq;
                  UVar18 = local_d8->offset;
                  prVar9[sVar8].litLength = ((int)puVar7 - (int)local_f0) - (int)puVar31;
                  prVar9[sVar8].matchLength = (int)local_e8 + (int)local_f0;
                  prVar9[sVar8].offset = (int)uVar20 - UVar18;
                  local_110->size = sVar8 + 1;
                  bVar15 = (byte)params->bucketSizeLog;
                  pBVar27 = ldmState->bucketOffsets;
                  bVar11 = pBVar27[local_e0];
                  ldmState->hashTable[(local_e0 << (bVar15 & 0x3f)) + (ulong)bVar11] =
                       (ldmEntry_t)(uVar20 & 0xffffffff | (ulong)uVar30 << 0x20);
                  pBVar27[local_e0] = ~(byte)(-1 << (bVar15 & 0x1f)) & bVar11 + 1;
                  puVar31 = (ulong *)((long)puVar7 + local_e8);
                  if (local_90 < puVar31) {
                    pBVar27 = (BYTE *)((long)puVar31 - local_168);
                    break;
                  }
                }
                uVar20 = local_60 + 1;
                pBVar27 = local_120;
              } while (local_60 + 1 != uVar19);
            }
            pBVar27 = pBVar27 + sVar13;
          } while (pBVar27 < pBVar37);
          uVar19 = (long)puVar24 - (long)puVar31;
        }
        if (0xffffffffffffff88 < uVar19) {
          return uVar19;
        }
        uVar20 = sequences->size;
        uVar30 = local_154;
      }
      if (local_130 < uVar20) {
        pUVar2 = &sequences->seq[local_130].litLength;
        *pUVar2 = *pUVar2 + (int)local_138;
      }
      else {
        uVar19 = local_c8 + local_138;
      }
      local_128 = local_128 + 1;
      local_138 = uVar19;
    } while (local_128 != local_c0);
  }
  return 0;
}

Assistant:

size_t ZSTD_ldm_generateSequences(
        ldmState_t* ldmState, rawSeqStore_t* sequences,
        ldmParams_t const* params, void const* src, size_t srcSize)
{
    U32 const maxDist = 1U << params->windowLog;
    BYTE const* const istart = (BYTE const*)src;
    BYTE const* const iend = istart + srcSize;
    size_t const kMaxChunkSize = 1 << 20;
    size_t const nbChunks = (srcSize / kMaxChunkSize) + ((srcSize % kMaxChunkSize) != 0);
    size_t chunk;
    size_t leftoverSize = 0;

    assert(ZSTD_CHUNKSIZE_MAX >= kMaxChunkSize);
    /* Check that ZSTD_window_update() has been called for this chunk prior
     * to passing it to this function.
     */
    assert(ldmState->window.nextSrc >= (BYTE const*)src + srcSize);
    /* The input could be very large (in zstdmt), so it must be broken up into
     * chunks to enforce the maximum distance and handle overflow correction.
     */
    assert(sequences->pos <= sequences->size);
    assert(sequences->size <= sequences->capacity);
    for (chunk = 0; chunk < nbChunks && sequences->size < sequences->capacity; ++chunk) {
        BYTE const* const chunkStart = istart + chunk * kMaxChunkSize;
        size_t const remaining = (size_t)(iend - chunkStart);
        BYTE const *const chunkEnd =
            (remaining < kMaxChunkSize) ? iend : chunkStart + kMaxChunkSize;
        size_t const chunkSize = chunkEnd - chunkStart;
        size_t newLeftoverSize;
        size_t const prevSize = sequences->size;

        assert(chunkStart < iend);
        /* 1. Perform overflow correction if necessary. */
        if (ZSTD_window_needOverflowCorrection(ldmState->window, 0, maxDist, ldmState->loadedDictEnd, chunkStart, chunkEnd)) {
            U32 const ldmHSize = 1U << params->hashLog;
            U32 const correction = ZSTD_window_correctOverflow(
                &ldmState->window, /* cycleLog */ 0, maxDist, chunkStart);
            ZSTD_ldm_reduceTable(ldmState->hashTable, ldmHSize, correction);
            /* invalidate dictionaries on overflow correction */
            ldmState->loadedDictEnd = 0;
        }
        /* 2. We enforce the maximum offset allowed.
         *
         * kMaxChunkSize should be small enough that we don't lose too much of
         * the window through early invalidation.
         * TODO: * Test the chunk size.
         *       * Try invalidation after the sequence generation and test the
         *         the offset against maxDist directly.
         *
         * NOTE: Because of dictionaries + sequence splitting we MUST make sure
         * that any offset used is valid at the END of the sequence, since it may
         * be split into two sequences. This condition holds when using
         * ZSTD_window_enforceMaxDist(), but if we move to checking offsets
         * against maxDist directly, we'll have to carefully handle that case.
         */
        ZSTD_window_enforceMaxDist(&ldmState->window, chunkEnd, maxDist, &ldmState->loadedDictEnd, NULL);
        /* 3. Generate the sequences for the chunk, and get newLeftoverSize. */
        newLeftoverSize = ZSTD_ldm_generateSequences_internal(
            ldmState, sequences, params, chunkStart, chunkSize);
        if (ZSTD_isError(newLeftoverSize))
            return newLeftoverSize;
        /* 4. We add the leftover literals from previous iterations to the first
         *    newly generated sequence, or add the `newLeftoverSize` if none are
         *    generated.
         */
        /* Prepend the leftover literals from the last call */
        if (prevSize < sequences->size) {
            sequences->seq[prevSize].litLength += (U32)leftoverSize;
            leftoverSize = newLeftoverSize;
        } else {
            assert(newLeftoverSize == chunkSize);
            leftoverSize += chunkSize;
        }
    }
    return 0;
}